

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_together.c
# Opt level: O1

int main(int argc,char **argv)

{
  int n_workers;
  int iVar1;
  
  n_workers = 0;
  if (1 < argc) {
    n_workers = atoi(argv[1]);
  }
  lace_set_verbosity(1);
  iVar1 = 5;
  do {
    runtests(n_workers);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return 0;
}

Assistant:

int
main (int argc, char *argv[])
{
    int n_workers = 0; // automatically detect number of workers

    if (argc > 1) {
        n_workers = atoi(argv[1]);
    }

    lace_set_verbosity(1);

    for (int i=0; i<5; i++) {
        runtests(n_workers);
    }

    return 0;
}